

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Node.hpp
# Opt level: O0

void __thiscall
CAMFImporter_NodeElement_Color::CAMFImporter_NodeElement_Color
          (CAMFImporter_NodeElement_Color *this,CAMFImporter_NodeElement *pParent)

{
  string *local_20;
  CAMFImporter_NodeElement *pParent_local;
  CAMFImporter_NodeElement_Color *this_local;
  
  CAMFImporter_NodeElement::CAMFImporter_NodeElement
            (&this->super_CAMFImporter_NodeElement,ENET_Color,pParent);
  (this->super_CAMFImporter_NodeElement)._vptr_CAMFImporter_NodeElement =
       (_func_int **)&PTR__CAMFImporter_NodeElement_Color_00f3fb98;
  this->Composed = false;
  local_20 = (string *)this->Color_Composed;
  do {
    std::__cxx11::string::string(local_20);
    local_20 = local_20 + 0x20;
  } while ((aiColor4D *)local_20 != &this->Color);
  aiColor4t<float>::aiColor4t(&this->Color);
  std::__cxx11::string::string((string *)&this->Profile);
  return;
}

Assistant:

CAMFImporter_NodeElement_Color(CAMFImporter_NodeElement* pParent)
	: CAMFImporter_NodeElement(ENET_Color, pParent)
    , Composed( false )
    , Color()
    , Profile() {
        // empty
    }